

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitstreamDecoder.cpp
# Opt level: O0

void scan_bitstream_mfm_fm(TrackData *trackdata)

{
  array<unsigned_char,_6UL> *paVar1;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  uint16_t uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  BitBuffer *this;
  pointer buf;
  size_type len;
  LogHelper *pLVar11;
  pointer ppVar12;
  pointer ppVar13;
  pointer pSVar14;
  int *piVar15;
  uchar *puVar16;
  byte *pbVar17;
  reference pvVar18;
  sbyte sVar19;
  EVP_PKEY_CTX *ctx;
  bool local_5a5;
  int local_53c;
  bool local_535;
  int local_534;
  int local_52c;
  int local_51c;
  int local_508;
  int local_2f0;
  int local_2ec;
  int local_2e8;
  char local_2e1;
  int splice_offset;
  string local_2b0;
  set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> local_290;
  undefined1 local_260 [8];
  set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> chk8k_methods;
  bool remove_gap3_4b;
  bool remove_gap2;
  bool has_gap3_4b;
  bool has_gap2;
  int gap2_offset;
  byte local_202;
  allocator<unsigned_char> local_201;
  undefined1 local_200 [6];
  bool bad_crc;
  Data data;
  int avail_bytes;
  int data_bytes;
  int normal_bytes;
  int extent_bytes;
  int iStack_1cc;
  bool read_gap2;
  int next_dam_bytes;
  int next_dam_distance;
  int next_dam_offset;
  int next_idam_align;
  int next_idam_bytes;
  int next_idam_distance;
  __normal_iterator<Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_> local_1b0;
  __normal_iterator<Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_> local_1a8;
  int local_1a0;
  byte local_199;
  int next_idam_offset;
  int iStack_194;
  uint8_t dam;
  int distance;
  int dam_track_offset;
  __normal_iterator<std::pair<int,_Encoding>_*,_std::vector<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>_>
  local_188;
  pair<int,_Encoding> *local_180;
  __normal_iterator<std::pair<int,_Encoding>_*,_std::vector<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>_>
  local_178;
  __normal_iterator<std::pair<int,_Encoding>_*,_std::vector<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>_>
  local_170;
  __normal_iterator<std::pair<int,_Encoding>_*,_std::vector<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>_>
  itDataNext;
  Encoding *data_encoding;
  int *dam_offset;
  __normal_iterator<std::pair<int,_Encoding>_*,_std::vector<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>_>
  local_150;
  iterator itData;
  int max_distance;
  int min_distance;
  int gap2_size;
  int shift;
  Sector *local_130;
  __normal_iterator<Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_> local_128;
  byte local_119;
  reference pSStack_118;
  bool final_sector;
  Sector *sector;
  __normal_iterator<Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_> local_108;
  iterator it;
  int local_f4;
  string local_f0;
  undefined1 local_d0 [8];
  Sector s;
  Header header;
  undefined1 uStack_74;
  array<unsigned_char,_6UL> id;
  uint8_t am;
  int am_offset;
  undefined1 local_68 [3];
  uint8_t last_fm_am;
  uint32_t dword;
  vector<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_> data_fields;
  CRC16 crc;
  BitBuffer *bitbuf;
  undefined1 local_30 [4];
  uint32_t sync_mask;
  Track track;
  TrackData *trackdata_local;
  
  track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)trackdata;
  Track::Track((Track *)local_30,0);
  uVar8 = -(uint)(opt.a1sync == 0) | 0xffdfffdf;
  this = TrackData::bitstream
                   ((TrackData *)
                    track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  BitBuffer::seek(this,0);
  local_30 = (undefined1  [4])BitBuffer::track_bitsize(this);
  CRC16::CRC16((CRC16 *)((long)&data_fields.
                                super__Vector_base<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 2),0xffff);
  std::vector<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>::vector
            ((vector<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_> *)
             local_68);
  am_offset = 0;
  am = '\0';
LAB_001b9638:
  do {
    bVar3 = BitBuffer::wrapped(this);
    if ((((bVar3 ^ 0xffU) & 1) == 0) ||
       ((iVar9 = Track::size((Track *)local_30), iVar9 == 0 &&
        (iVar9 = BitBuffer::tell(this), (int)local_30 < iVar9)))) {
      local_108._M_current = (Sector *)Track::begin((Track *)local_30);
      do {
        sector = (Sector *)Track::end((Track *)local_30);
        bVar3 = __gnu_cxx::operator!=
                          (&local_108,
                           (__normal_iterator<Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>
                            *)&sector);
        if (!bVar3) {
          TrackData::add((TrackData *)
                         track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage,(Track *)local_30);
          std::vector<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>::~vector
                    ((vector<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_> *
                     )local_68);
          Track::~Track((Track *)local_30);
          return;
        }
        pSStack_118 = __gnu_cxx::
                      __normal_iterator<Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
                      operator*(&local_108);
        local_130 = local_108._M_current;
        local_128 = std::
                    next<__gnu_cxx::__normal_iterator<Sector*,std::vector<Sector,std::allocator<Sector>>>>
                              (local_108,1);
        _gap2_size = Track::end((Track *)local_30);
        local_119 = __gnu_cxx::operator==
                              (&local_128,
                               (__normal_iterator<Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>
                                *)&gap2_size);
        min_distance = pSStack_118->encoding == FM | 4;
        iVar9 = 0x16;
        if (pSStack_118->datarate == _1M) {
          iVar9 = 0x29;
        }
        itData._M_current._4_4_ = (7 << (sbyte)min_distance) + iVar9 * 0x10;
        itData._M_current._0_4_ = iVar9 * 0x10 + 0x170 + (7 << (sbyte)min_distance);
        bVar3 = Sector::has_badidcrc(pSStack_118);
        if (!bVar3) {
          if (opt.debug != 0) {
            pLVar11 = util::operator<<((LogHelper *)&util::cout,
                                       (char (*) [22])"  s_b_mfm_fm finding ");
            pLVar11 = util::operator<<(pLVar11,(CylHead *)
                                               track.m_sectors.
                                               super__Vector_base<Sector,_std::allocator<Sector>_>.
                                               _M_impl.super__Vector_impl_data._M_end_of_storage);
            pLVar11 = util::operator<<(pLVar11,(char (*) [9])0x2ab23d);
            pLVar11 = util::operator<<(pLVar11,&(pSStack_118->header).sector);
            util::operator<<(pLVar11,(char (*) [3])0x2a74c9);
          }
          local_150._M_current =
               (pair<int,_Encoding> *)
               std::vector<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>::
               begin((vector<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_> *
                     )local_68);
          while( true ) {
            dam_offset = (int *)std::
                                vector<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>
                                ::end((vector<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>
                                       *)local_68);
            bVar3 = __gnu_cxx::operator!=
                              (&local_150,
                               (__normal_iterator<std::pair<int,_Encoding>_*,_std::vector<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>_>
                                *)&dam_offset);
            if (!bVar3) break;
            ppVar12 = __gnu_cxx::
                      __normal_iterator<std::pair<int,_Encoding>_*,_std::vector<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>_>
                      ::operator->(&local_150);
            ppVar13 = __gnu_cxx::
                      __normal_iterator<std::pair<int,_Encoding>_*,_std::vector<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>_>
                      ::operator->(&local_150);
            itDataNext._M_current = (pair<int,_Encoding> *)&ppVar13->second;
            local_180 = local_150._M_current;
            local_178 = std::
                        next<__gnu_cxx::__normal_iterator<std::pair<int,Encoding>*,std::vector<std::pair<int,Encoding>,std::allocator<std::pair<int,Encoding>>>>>
                                  (local_150,1);
            local_188._M_current =
                 (pair<int,_Encoding> *)
                 std::vector<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>::
                 end((vector<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_> *
                     )local_68);
            bVar3 = __gnu_cxx::operator==(&local_178,&local_188);
            if (bVar3) {
              local_170._M_current =
                   (pair<int,_Encoding> *)
                   std::vector<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>
                   ::begin((vector<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>
                            *)local_68);
            }
            else {
              _distance = local_150._M_current;
              local_170 = std::
                          next<__gnu_cxx::__normal_iterator<std::pair<int,Encoding>*,std::vector<std::pair<int,Encoding>,std::allocator<std::pair<int,Encoding>>>>>
                                    (local_150,1);
            }
            if ((itDataNext._M_current)->first == pSStack_118->encoding) {
              iStack_194 = BitBuffer::track_offset(this,ppVar12->first);
              if (iStack_194 < pSStack_118->offset) {
                local_508 = (int)local_30;
              }
              else {
                local_508 = 0;
              }
              next_idam_offset = (local_508 + iStack_194) - pSStack_118->offset;
              if ((itData._M_current._4_4_ <= next_idam_offset) &&
                 (next_idam_offset <= (int)itData._M_current)) {
                BitBuffer::seek(this,ppVar12->first);
                this->encoding = (itDataNext._M_current)->first;
                local_199 = BitBuffer::read_byte(this);
                ctx = (EVP_PKEY_CTX *)0xffff;
                if ((itDataNext._M_current)->first == 1) {
                  ctx = (EVP_PKEY_CTX *)0xcdb4;
                }
                CRC16::init((CRC16 *)((long)&data_fields.
                                             super__Vector_base<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 2)
                            ,ctx);
                CRC16::add((CRC16 *)((long)&data_fields.
                                            super__Vector_base<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 2),
                           (uint)local_199);
                if (((itDataNext._M_current)->first == 2) && (local_199 == 0xfd)) {
                  pSStack_118->encoding = RX02;
                  (pSStack_118->header).size = (pSStack_118->header).size + 1;
                  this->encoding = MFM;
                  min_distance = 4;
                }
                if ((local_119 & 1) == 0) {
                  _next_idam_bytes = local_108._M_current;
                  local_1b0 = std::
                              next<__gnu_cxx::__normal_iterator<Sector*,std::vector<Sector,std::allocator<Sector>>>>
                                        (local_108,1);
                  pSVar14 = __gnu_cxx::
                            __normal_iterator<Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>
                            ::operator->(&local_1b0);
                  local_51c = pSVar14->offset;
                }
                else {
                  local_1a8._M_current = (Sector *)Track::begin((Track *)local_30);
                  pSVar14 = __gnu_cxx::
                            __normal_iterator<Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>
                            ::operator->(&local_1a8);
                  local_51c = pSVar14->offset;
                }
                local_1a0 = local_51c;
                if (iStack_194 < local_51c) {
                  local_52c = 0;
                }
                else {
                  local_52c = (int)local_30;
                }
                next_idam_align = (local_52c + local_51c) - iStack_194;
                sVar19 = (sbyte)min_distance;
                next_dam_offset = (next_idam_align >> sVar19) + -1;
                next_dam_distance = next_idam_align & (1 << sVar19) - 1U;
                ppVar13 = __gnu_cxx::
                          __normal_iterator<std::pair<int,_Encoding>_*,_std::vector<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>_>
                          ::operator->(&local_170);
                next_dam_bytes = ppVar13->first;
                if (ppVar12->first < next_dam_bytes) {
                  local_534 = 0;
                }
                else {
                  local_534 = BitBuffer::size(this);
                }
                iStack_1cc = (local_534 + next_dam_bytes) - ppVar12->first;
                extent_bytes = (iStack_1cc >> sVar19) + -1;
                bVar3 = (local_119 & 1) == 0;
                local_535 = bVar3 && opt.gap2 != 0;
                normal_bytes._3_1_ = local_535;
                local_53c = extent_bytes;
                if (!bVar3 || opt.gap2 == 0) {
                  local_53c = next_dam_offset;
                }
                data_bytes = local_53c;
                if ((2 < local_53c) && (pSStack_118->encoding == MFM)) {
                  data_bytes = local_53c + -3;
                }
                iVar9 = Sector::size(pSStack_118);
                avail_bytes = iVar9 + 2;
                piVar15 = std::max<int>(&avail_bytes,&data_bytes);
                iVar9 = *piVar15;
                iVar10 = BitBuffer::remaining(this);
                data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ = iVar10 >> sVar19;
                if (data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_ < avail_bytes) {
                  iVar10 = Sector::copies(pSStack_118);
                  if ((iVar10 != 0) &&
                     ((bVar3 = Sector::is_8k_sector(pSStack_118), !bVar3 ||
                      (data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_ < 0x1802)))) {
                    if (opt.debug != 0) {
                      util::operator<<((LogHelper *)&util::cout,
                                       (char (*) [45])
                                       "  s_b_mfm_fm ignoring truncated sector copy\n");
                    }
                    goto LAB_001bb06a;
                  }
                  if (opt.debug != 0) {
                    util::operator<<((LogHelper *)&util::cout,
                                     (char (*) [55])
                                     "  s_b_mfm_fm using truncated sector data as only copy\n");
                  }
                }
                std::allocator<unsigned_char>::allocator(&local_201);
                Data::vector((Data *)local_200,(long)iVar9,&local_201);
                std::allocator<unsigned_char>::~allocator(&local_201);
                BitBuffer::read<Data>(this,(Data *)local_200);
                puVar16 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     local_200);
                uVar7 = CRC16::add((CRC16 *)((long)&data_fields.
                                                                                                        
                                                  super__Vector_base<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 2),puVar16,(long)avail_bytes);
                local_202 = uVar7 != 0;
                if ((opt.debug != 0) && ((bool)local_202)) {
                  iVar9 = Sector::size(pSStack_118);
                  pbVar17 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       local_200,(long)iVar9);
                  bVar4 = *pbVar17;
                  iVar9 = Sector::size(pSStack_118);
                  pbVar17 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       local_200,(long)(iVar9 + 1));
                  bVar2 = *pbVar17;
                  bVar5 = CRC16::msb((CRC16 *)((long)&data_fields.
                                                                                                            
                                                  super__Vector_base<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              + 2));
                  bVar6 = CRC16::lsb((CRC16 *)((long)&data_fields.
                                                                                                            
                                                  super__Vector_base<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              + 2));
                  util::fmt_abi_cxx11_
                            ((string *)&remove_gap3_4b,
                             "  s_b_mfm_fm bad data CRC: %02X %02X, expected %02X %02X\n",
                             (ulong)bVar4,(ulong)bVar2,(ulong)bVar5,(ulong)bVar6);
                  util::operator<<((LogHelper *)&util::cout,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&remove_gap3_4b);
                  std::__cxx11::string::~string((string *)&remove_gap3_4b);
                }
                iVar9 = data_bytes;
                if ((opt.keepoverlap == 0) && (iVar10 = Sector::size(pSStack_118), iVar9 < iVar10))
                {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_200,
                             (long)data_bytes);
                }
                else {
                  iVar9 = Data::size((Data *)local_200);
                  iVar10 = Sector::size(pSStack_118);
                  if ((iVar10 < iVar9) &&
                     ((opt.gaps == 0 || ((opt.gap4b == 0 && ((local_119 & 1) != 0)))))) {
                    iVar9 = Sector::size(pSStack_118);
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_200,
                               (long)iVar9);
                  }
                }
                chk8k_methods._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
                     next_dam_offset + 7;
                iVar9 = Data::size((Data *)local_200);
                chk8k_methods._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ =
                     chk8k_methods._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ <= iVar9;
                iVar9 = Data::size((Data *)local_200);
                chk8k_methods._M_t._M_impl.super__Rb_tree_header._M_node_count._2_1_ =
                     avail_bytes <= iVar9;
                chk8k_methods._M_t._M_impl.super__Rb_tree_header._M_node_count._1_1_ = false;
                chk8k_methods._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = 0;
                if ((chk8k_methods._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ & 1) != 0)
                {
                  local_5a5 = true;
                  if (next_dam_distance == 0) {
                    pvVar18 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         local_200,(long)next_dam_offset);
                    local_5a5 = true;
                    if (*pvVar18 == 0xfe) {
                      local_5a5 = test_remove_gap2((Data *)local_200,
                                                   chk8k_methods._M_t._M_impl.super__Rb_tree_header.
                                                   _M_node_count._4_4_);
                    }
                  }
                  chk8k_methods._M_t._M_impl.super__Rb_tree_header._M_node_count._1_1_ = local_5a5;
                }
                if ((chk8k_methods._M_t._M_impl.super__Rb_tree_header._M_node_count._2_1_ & 1) != 0)
                {
                  if ((local_119 & 1) == 0) {
                    chk8k_methods._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ =
                         test_remove_gap3((Data *)local_200,avail_bytes,&pSStack_118->gap3);
                  }
                  else {
                    chk8k_methods._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ =
                         test_remove_gap4b((Data *)local_200,avail_bytes);
                  }
                }
                if (opt.gaps != 2) {
                  if (((chk8k_methods._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ & 1) ==
                       0) || ((chk8k_methods._M_t._M_impl.super__Rb_tree_header._M_node_count._1_1_
                              & 1) == 0)) {
                    if (((chk8k_methods._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ & 1)
                         != 0) && (opt.debug != 0)) {
                      util::operator<<((LogHelper *)&util::cout,
                                       (char (*) [36])"  s_b_mfm_fm skipping gap2 removal\n");
                    }
                  }
                  else {
                    if (opt.debug != 0) {
                      util::operator<<((LogHelper *)&util::cout,
                                       (char (*) [33])"  s_b_mfm_fm removing gap2 data\n");
                    }
                    bVar3 = pSStack_118->encoding == MFM;
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_200,
                               (long)(int)(next_dam_offset - ((uint)bVar3 + (uint)bVar3 * 2)));
                  }
                  if ((((chk8k_methods._M_t._M_impl.super__Rb_tree_header._M_node_count._2_1_ & 1)
                        != 0) &&
                      (((byte)chk8k_methods._M_t._M_impl.super__Rb_tree_header._M_node_count & 1) !=
                       0)) && (((chk8k_methods._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                 _3_1_ & 1) == 0 ||
                               ((chk8k_methods._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                 _1_1_ & 1) != 0)))) {
                    if ((local_119 & 1) == 0) {
                      if (opt.debug != 0) {
                        util::operator<<((LogHelper *)&util::cout,
                                         (char (*) [33])"  s_b_mfm_fm removing gap3 data\n");
                      }
                      iVar9 = Sector::size(pSStack_118);
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_200,
                                 (long)iVar9);
                    }
                    else {
                      if (opt.debug != 0) {
                        util::operator<<((LogHelper *)&util::cout,
                                         (char (*) [34])"  s_b_mfm_fm removing gap4b data\n");
                      }
                      iVar9 = Sector::size(pSStack_118);
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_200,
                                 (long)iVar9);
                    }
                  }
                }
                std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::set
                          ((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                            *)local_260);
                bVar3 = Sector::is_8k_sector(pSStack_118);
                if (bVar3) {
                  puVar16 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       local_200);
                  iVar9 = Data::size((Data *)local_200);
                  ChecksumMethods(&local_290,puVar16,iVar9);
                  std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::
                  operator=((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                             *)local_260,&local_290);
                  std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::
                  ~set(&local_290);
                  if (opt.debug != 0) {
                    pLVar11 = util::operator<<((LogHelper *)&util::cout,
                                               (char (*) [29])"  s_b_mfm_fm chk8k_method = ");
                    std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::
                    set((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *
                        )&splice_offset,
                        (set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *
                        )local_260);
                    ChecksumName_abi_cxx11_
                              (&local_2b0,
                               (set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                                *)&splice_offset);
                    pLVar11 = util::operator<<(pLVar11,&local_2b0);
                    local_2e1 = '\n';
                    util::operator<<(pLVar11,&local_2e1);
                    std::__cxx11::string::~string((string *)&local_2b0);
                    std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::
                    ~set((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                          *)&splice_offset);
                  }
                }
                if ((((local_119 & 1) != 0) && ((local_202 & 1) == 0)) &&
                   (local_2e8 = BitBuffer::track_offset
                                          (this,ppVar12->first + (avail_bytes << sVar19)),
                   local_2e8 < ppVar12->first)) {
                  local_2ec = BitBuffer::splicepos(this);
                  piVar15 = std::max<int>(&local_2e8,&local_2ec);
                  BitBuffer::splicepos(this,*piVar15);
                }
                Sector::add(pSStack_118,(Data *)local_200,(bool)(local_202 & 1),local_199);
                if (((local_202 & 1) == 0) ||
                   (bVar3 = std::
                            set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                            ::empty((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                                     *)local_260), !bVar3)) {
                  local_2f0 = 9;
                }
                else {
                  local_2f0 = 0;
                }
                std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::~set
                          ((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                            *)local_260);
                Data::~Data((Data *)local_200);
                if (local_2f0 != 0) break;
              }
            }
LAB_001bb06a:
            __gnu_cxx::
            __normal_iterator<std::pair<int,_Encoding>_*,_std::vector<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>_>
            ::operator++(&local_150);
          }
        }
        __gnu_cxx::__normal_iterator<Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
        operator++(&local_108);
      } while( true );
    }
    bVar4 = BitBuffer::read1(this);
    am_offset = am_offset * 2 | (uint)bVar4;
    if ((am_offset & uVar8) != 0x44894489) goto LAB_001b9741;
    uVar7 = BitBuffer::read16(this);
  } while ((uVar7 & uVar8) != 0x4489);
  this->encoding = MFM;
  CRC16::init((CRC16 *)((long)&data_fields.
                               super__Vector_base<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 2),
              (EVP_PKEY_CTX *)0xcdb4);
  goto LAB_001b9817;
LAB_001b9741:
  if ((opt.encoding != MFM) &&
     (((am_offset == 0xaa222888 || (am_offset == 0xaa22288a)) ||
      ((am_offset == 0xaa2228a8 ||
       ((((am_offset == 0xaa2228aa || (am_offset == 0xaa222a8a)) || (am_offset == 0xaa222aa8)) ||
        (am_offset == 0xaa2a2a88)))))))) {
    iVar9 = BitBuffer::tell(this);
    BitBuffer::seek(this,iVar9 + -0x20);
    this->encoding = FM;
    CRC16::init((CRC16 *)((long)&data_fields.
                                 super__Vector_base<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 2),
                (EVP_PKEY_CTX *)0xffff);
LAB_001b9817:
    _uStack_74 = BitBuffer::tell(this);
    header.size._3_1_ = BitBuffer::read_byte(this);
    CRC16::add((CRC16 *)((long)&data_fields.
                                super__Vector_base<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 2),
               (uint)header.size._3_1_);
    switch(header.size._3_1_) {
    case 0xf8:
    case 0xf9:
    case 0xfa:
    case 0xfb:
    case 0xfd:
      if (this->encoding == FM) {
        if (am != 0xfe) break;
        am = header.size._3_1_;
      }
      if (opt.debug != 0) {
        pLVar11 = util::operator<<((LogHelper *)&util::cout,(char (*) [12])"s_b_mfm_fm ");
        pLVar11 = util::operator<<(pLVar11,&this->encoding);
        pLVar11 = util::operator<<(pLVar11,(char (*) [10])0x2a5749);
        pLVar11 = util::operator<<(pLVar11,(uchar *)((long)&header.size + 3));
        pLVar11 = util::operator<<(pLVar11,(char (*) [13])") at offset ");
        pLVar11 = util::operator<<(pLVar11,(int *)&uStack_74);
        pLVar11 = util::operator<<(pLVar11,(char (*) [3])0x2a84f9);
        local_f4 = BitBuffer::track_offset(this,_uStack_74);
        pLVar11 = util::operator<<(pLVar11,&local_f4);
        util::operator<<(pLVar11,(char (*) [3])0x2a981c);
      }
      register0x00000000 = std::make_pair<int&,Encoding&>((int *)&uStack_74,&this->encoding);
      std::vector<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>::push_back
                ((vector<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_> *)
                 local_68,(value_type *)((long)&it._M_current + 4));
      break;
    case 0xfc:
      if (opt.debug != 0) {
        pLVar11 = util::operator<<((LogHelper *)&util::cout,(char (*) [12])"s_b_mfm_fm ");
        pLVar11 = util::operator<<(pLVar11,&this->encoding);
        pLVar11 = util::operator<<(pLVar11,(char (*) [16])" IAM at offset ");
        pLVar11 = util::operator<<(pLVar11,(int *)&uStack_74);
        pLVar11 = util::operator<<(pLVar11,(char (*) [3])0x2a84f9);
        it._M_current._0_4_ = BitBuffer::track_offset(this,_uStack_74);
        pLVar11 = util::operator<<(pLVar11,(int *)&it);
        util::operator<<(pLVar11,(char (*) [3])0x2a981c);
      }
      break;
    case 0xfe:
      BitBuffer::read<std::array<unsigned_char,6ul>>
                (this,(array<unsigned_char,_6UL> *)((long)&header.sector + 1));
      paVar1 = (array<unsigned_char,_6UL> *)((long)&header.sector + 1);
      buf = std::array<unsigned_char,_6UL>::data(paVar1);
      len = std::array<unsigned_char,_6UL>::size(paVar1);
      CRC16::add((CRC16 *)((long)&data_fields.
                                  super__Vector_base<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 2),buf,len);
      uVar7 = CRC16::operator_cast_to_unsigned_short
                        ((CRC16 *)((long)&data_fields.
                                          super__Vector_base<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
      if ((uVar7 == 0) || ((opt.idcrc == 1 && (this->encoding != FM)))) {
        paVar1 = (array<unsigned_char,_6UL> *)((long)&header.sector + 1);
        pbVar17 = std::array<unsigned_char,_6UL>::operator[](paVar1,0);
        bVar4 = *pbVar17;
        pbVar17 = std::array<unsigned_char,_6UL>::operator[](paVar1,1);
        bVar2 = *pbVar17;
        pbVar17 = std::array<unsigned_char,_6UL>::operator[](paVar1,2);
        bVar5 = *pbVar17;
        pbVar17 = std::array<unsigned_char,_6UL>::operator[](paVar1,3);
        Header::Header((Header *)
                       ((long)&s.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 4),(uint)bVar4,
                       (uint)bVar2,(uint)bVar5,(uint)*pbVar17);
        Sector::Sector((Sector *)local_d0,this->datarate,this->encoding,
                       (Header *)
                       ((long)&s.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 4),0);
        uVar7 = CRC16::operator_cast_to_unsigned_short
                          ((CRC16 *)((long)&data_fields.
                                            super__Vector_base<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 2))
        ;
        Sector::set_badidcrc((Sector *)local_d0,uVar7 != 0);
        s.datarate = BitBuffer::track_offset(this,_uStack_74);
        if (opt.debug != 0) {
          pLVar11 = util::operator<<((LogHelper *)&util::cout,(char (*) [12])"s_b_mfm_fm ");
          pLVar11 = util::operator<<(pLVar11,&this->encoding);
          pLVar11 = util::operator<<(pLVar11,(char (*) [11])0x2a5555);
          pLVar11 = util::operator<<(pLVar11,&header.cyl);
          pLVar11 = util::operator<<(pLVar11,(char (*) [13])") at offset ");
          pLVar11 = util::operator<<(pLVar11,(int *)&uStack_74);
          pLVar11 = util::operator<<(pLVar11,(char (*) [3])0x2a84f9);
          pLVar11 = util::operator<<(pLVar11,(int *)&s.datarate);
          util::operator<<(pLVar11,(char (*) [3])0x2a981c);
        }
        Track::add((Track *)local_30,(Sector *)local_d0);
        if ((opt.debug != 0) &&
           (uVar7 = CRC16::operator_cast_to_unsigned_short
                              ((CRC16 *)((long)&data_fields.
                                                super__Vector_base<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                        2)), uVar7 != 0)) {
          paVar1 = (array<unsigned_char,_6UL> *)((long)&header.sector + 1);
          pbVar17 = std::array<unsigned_char,_6UL>::operator[](paVar1,4);
          bVar4 = *pbVar17;
          pbVar17 = std::array<unsigned_char,_6UL>::operator[](paVar1,5);
          bVar2 = *pbVar17;
          bVar5 = CRC16::msb((CRC16 *)((long)&data_fields.
                                              super__Vector_base<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 2
                                      ));
          bVar6 = CRC16::lsb((CRC16 *)((long)&data_fields.
                                              super__Vector_base<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 2
                                      ));
          util::fmt_abi_cxx11_
                    (&local_f0,"  s_b_mfm_fm bad id CRC: %02X %02X, expected %02X %02X\n",
                     (ulong)bVar4,(ulong)bVar2,(ulong)bVar5,(ulong)bVar6);
          util::operator<<((LogHelper *)&util::cout,&local_f0);
          std::__cxx11::string::~string((string *)&local_f0);
        }
        if (this->encoding == FM) {
          am = header.size._3_1_;
        }
        Sector::~Sector((Sector *)local_d0);
      }
      break;
    default:
      if (opt.debug != 0) {
        pLVar11 = util::operator<<((LogHelper *)&util::cout,(char (*) [20])"s_b_mfm_fm unknown ");
        pLVar11 = util::operator<<(pLVar11,&this->encoding);
        pLVar11 = util::operator<<(pLVar11,(char (*) [6])0x2a84f6);
        pLVar11 = util::operator<<(pLVar11,std::hex);
        pLVar11 = util::operator<<(pLVar11,(uchar *)((long)&header.size + 3));
        pLVar11 = util::operator<<(pLVar11,std::dec);
        pLVar11 = util::operator<<(pLVar11,(char (*) [13])") at offset ");
        pLVar11 = util::operator<<(pLVar11,(int *)&uStack_74);
        pLVar11 = util::operator<<(pLVar11,(char (*) [5])0x2abe57);
        pLVar11 = util::operator<<(pLVar11,(CylHead *)
                                           track.m_sectors.
                                           super__Vector_base<Sector,_std::allocator<Sector>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage);
        util::operator<<(pLVar11,(char (*) [2])0x2a74b6);
      }
    }
  }
  goto LAB_001b9638;
}

Assistant:

void scan_bitstream_mfm_fm(TrackData& trackdata)
{
    Track track;
    uint32_t sync_mask = opt.a1sync ? 0xffdfffdf : 0xffffffff;

    auto& bitbuf = trackdata.bitstream();
    bitbuf.seek(0);
    track.tracklen = bitbuf.track_bitsize();

    CRC16 crc;
    std::vector<std::pair<int, Encoding>> data_fields;

    uint32_t dword = 0;
    uint8_t last_fm_am = 0;

    while (!bitbuf.wrapped())
    {
        // Give up if no headers were found in the first revolution
        if (!track.size() && bitbuf.tell() > track.tracklen)
            break;

        dword = (dword << 1) | bitbuf.read1();

        if ((dword & sync_mask) == 0x44894489)
        {
            if ((bitbuf.read16() & sync_mask) != 0x4489) continue;

            bitbuf.encoding = Encoding::MFM;
            crc.init(CRC16::A1A1A1);
        }
        else if (opt.encoding == Encoding::MFM) // FM disabled?
            continue;
        else
        {
            // Check for known FM address marks
            switch (dword)
            {
            case 0xaa222888:    // F8/C7 DDAM
            case 0xaa22288a:    // F9/C7 Alt-DDAM
            case 0xaa2228a8:    // FA/C7 Alt-DAM
            case 0xaa2228aa:    // FB/C7 DAM
            case 0xaa2a2a88:    // FC/D7 IAM
            case 0xaa222a8a:    // FD/C7 RX02 DAM
            case 0xaa222aa8:    // FE/C7 IDAM
                break;

                // Not a recognised FM mark, so keep searching
            default:
                continue;
            }

            // With FM the address mark is also the sync, so step back to read it again
            bitbuf.seek(bitbuf.tell() - 32);

            bitbuf.encoding = Encoding::FM;
            crc.init();
        }

        auto am_offset = bitbuf.tell();
        auto am = bitbuf.read_byte();
        crc.add(am);

        switch (am)
        {
        case 0xfe:  // IDAM
        {
            std::array<uint8_t, 6> id;  // CHRN + 16-bit CRC
            bitbuf.read(id);

            // Check header CRC, skipping if it's bad, unless the user wants it.
            // Don't allow FM sectors with ID CRC errors, due to the false-positive risk.
            crc.add(id.data(), id.size());
            if (!crc || (opt.idcrc == 1 && bitbuf.encoding != Encoding::FM))
            {
                Header header(id[0], id[1], id[2], id[3]);
                Sector s(bitbuf.datarate, bitbuf.encoding, header);
                s.set_badidcrc(crc != 0);
                s.offset = bitbuf.track_offset(am_offset);

                if (opt.debug)
                    util::cout << "s_b_mfm_fm " << bitbuf.encoding << " IDAM (id=" << header.sector << ") at offset " << am_offset << " (" << s.offset << ")\n";
                track.add(std::move(s));

                if (opt.debug && crc != 0)
                {
                    util::cout << util::fmt("  s_b_mfm_fm bad id CRC: %02X %02X, expected %02X %02X\n",
                        id[4], id[5], crc.msb(), crc.lsb());
                }

                if (bitbuf.encoding == Encoding::FM)
                    last_fm_am = am;
            }
            break;
        }

        case 0xfb: case 0xfa:   // normal data (+alt)
        case 0xf8: case 0xf9:   // deleted data (+alt)
        case 0xfd:              // RX02
        {
            // FM address marks are short, so false positives are likely.
            if (bitbuf.encoding == Encoding::FM)
            {
                // Require a valid FM IDAM before we accept an FM DAM.
                if (last_fm_am != 0xfe)
                    break;

                last_fm_am = am;
            }

            if (opt.debug)
                util::cout << "s_b_mfm_fm " << bitbuf.encoding << " DAM (am=" << am << ") at offset " << am_offset << " (" << bitbuf.track_offset(am_offset) << ")\n";
            data_fields.push_back(std::make_pair(am_offset, bitbuf.encoding));
            break;
        }

        case 0xfc:  // IAM
            if (opt.debug)
                util::cout << "s_b_mfm_fm " << bitbuf.encoding << " IAM at offset " << am_offset << " (" << bitbuf.track_offset(am_offset) << ")\n";
            break;

        default:
            if (opt.debug)
                util::cout << "s_b_mfm_fm unknown " << bitbuf.encoding << " AM (" << std::hex << am << std::dec << ") at offset " << am_offset << " on " << trackdata.cylhead << "\n";
            break;
        }
    }

    // Process each sector header to look for an associated data field
    for (auto it = track.begin(); it != track.end(); ++it)
    {
        auto& sector = *it;
        auto final_sector = std::next(it) == track.end();

        auto shift = (sector.encoding == Encoding::FM) ? 5 : 4;
        auto gap2_size = (sector.datarate == DataRate::_1M) ? GAP2_MFM_ED : GAP2_MFM_DDHD;  // gap2 size in MFM bytes (FM is half size but double encoding overhead)
        auto min_distance = ((1 + 6) << shift) + (gap2_size << 4);          // AM, ID, gap2 (fixed shift as FM is half size)
        auto max_distance = ((1 + 6) << shift) + ((23 + gap2_size) << 4);       // 1=AM, 6=ID, 21+gap2=max WD177x offset (gap2 may be longer when formatted by different type of controller)

        // If the header has a CRC error, the data can't be reached
        if (sector.has_badidcrc())
            continue;

        if (opt.debug)
            util::cout << "  s_b_mfm_fm finding " << trackdata.cylhead << " sector " << sector.header.sector << ":\n";

        for (auto itData = data_fields.begin(); itData != data_fields.end(); ++itData)
        {
            const auto& dam_offset = itData->first;
            const Encoding& data_encoding = itData->second;
            auto itDataNext = (std::next(itData) == data_fields.end()) ? data_fields.begin() : std::next(itData);

            // Data field must be the same encoding type
            if (data_encoding != sector.encoding)
                continue;

            // Determine distance from header to data field, taking care of track wrapping
            auto dam_track_offset = bitbuf.track_offset(dam_offset);
            auto distance = ((dam_track_offset < sector.offset) ? track.tracklen : 0) + dam_track_offset - sector.offset;

            // Reject if the data field is too close or too far away
            if (distance < min_distance || distance > max_distance)
                continue;

            bitbuf.seek(dam_offset);
            bitbuf.encoding = data_encoding;

            auto dam = bitbuf.read_byte();
            crc.init((data_encoding == Encoding::MFM) ? CRC16::A1A1A1 : CRC16::INIT_CRC);
            crc.add(dam);

            // RX02 modified MFM uses an FM DAM followed by MFM data and CRC.
            if (data_encoding == Encoding::FM && dam == 0xfd)
            {
                // Convert the sector to RX02, its size to match the data.
                sector.encoding = Encoding::RX02;
                ++sector.header.size;

                // Switch to decoding the data as MFM.
                bitbuf.encoding = Encoding::MFM;
                shift = 4;
            }

            // Determine the offset and distance to the next IDAM, taking care of track wrap if it's the final sector
            auto next_idam_offset = final_sector ? track.begin()->offset : std::next(it)->offset;
            auto next_idam_distance = ((next_idam_offset <= dam_track_offset) ? track.tracklen : 0) + next_idam_offset - dam_track_offset;
            auto next_idam_bytes = (next_idam_distance >> shift) - 1;   // -1 due to DAM being read above
            auto next_idam_align = next_idam_distance & ((1 << shift) - 1);

            // Determine the bit offset and distance to the next DAM
            auto next_dam_offset = itDataNext->first;
            auto next_dam_distance = ((next_dam_offset <= dam_offset) ? bitbuf.size() : 0) + next_dam_offset - dam_offset;
            auto next_dam_bytes = (next_dam_distance >> shift) - 1;     // -1 due to DAM being read above

            // Attempt to read gap2 from non-final sectors, unless we're asked not to
            auto read_gap2 = !final_sector && (opt.gap2 != 0);

            // Calculate the extent of the current data field, up to the next header or data field (depending if gap2 is required)
            auto extent_bytes = read_gap2 ? next_dam_bytes : next_idam_bytes;
            if (extent_bytes >= 3 && sector.encoding == Encoding::MFM) extent_bytes -= 3;   // remove A1A1A1

            auto normal_bytes = sector.size() + 2;                  // data size + CRC bytes
            auto data_bytes = std::max(normal_bytes, extent_bytes); // data size needed to check CRC

            // Calculate bytes remaining in the data in current data encoding
            auto avail_bytes = bitbuf.remaining() >> shift;

            // Ignore truncated copies, unless it's the only copy we have
            if (avail_bytes < normal_bytes)
            {
                // If we've already got a copy, ignore the truncated version
                if (sector.copies() && (!sector.is_8k_sector() || avail_bytes < 0x1802))    // ToDo: fix nasty check
                {
                    if (opt.debug)
                        util::cout << "  s_b_mfm_fm ignoring truncated sector copy\n";
                    continue;
                }

                if (opt.debug)
                    util::cout << "  s_b_mfm_fm using truncated sector data as only copy\n";
            }

            // Read the full data field and check its CRC
            Data data(data_bytes);
            bitbuf.read(data);
            bool bad_crc = crc.add(data.data(), normal_bytes) != 0;
            if (opt.debug && bad_crc)
            {
                util::cout << util::fmt("  s_b_mfm_fm bad data CRC: %02X %02X, expected %02X %02X\n",
                    data[sector.size()], data[sector.size() + 1], crc.msb(), crc.lsb());
            }

            // Truncate at the extent size, unless we're asked to keep overlapping sectors
            if (!opt.keepoverlap && extent_bytes < sector.size())
                data.resize(extent_bytes);
            else if (data.size() > sector.size() && (opt.gaps == GAPS_NONE || (opt.gap4b == 0 && final_sector)))
                data.resize(sector.size());

            auto gap2_offset = next_idam_bytes + 1 + 4 + 2;
            auto has_gap2 = data.size() >= gap2_offset;
            auto has_gap3_4b = data.size() >= normal_bytes;
            auto remove_gap2 = false;
            auto remove_gap3_4b = false;

            // Check IDAM bit alignment and value, as AnglaisCollege\track00.0.raw has rogue FE junk on cyls 22+26
            if (has_gap2)
                remove_gap2 = next_idam_align != 0 || data[next_idam_bytes] != 0xfe || test_remove_gap2(data, gap2_offset);

            if (has_gap3_4b)
            {
                if (final_sector)
                    remove_gap3_4b = test_remove_gap4b(data, normal_bytes);
                else
                    remove_gap3_4b = test_remove_gap3(data, normal_bytes, sector.gap3);
            }

            if (opt.gaps != GAPS_ALL)
            {
                if (has_gap2 && remove_gap2)
                {
                    if (opt.debug)
                        util::cout << "  s_b_mfm_fm removing gap2 data\n";
                    data.resize(next_idam_bytes - ((sector.encoding == Encoding::MFM) ? 3 : 0));
                }
                else if (has_gap2)
                {
                    if (opt.debug)
                        util::cout << "  s_b_mfm_fm skipping gap2 removal\n";
                }

                if (has_gap3_4b && remove_gap3_4b && (!has_gap2 || remove_gap2))
                {
                    if (!final_sector)
                    {
                        if (opt.debug)
                            util::cout << "  s_b_mfm_fm removing gap3 data\n";
                        data.resize(sector.size());
                    }
                    else
                    {
                        if (opt.debug)
                            util::cout << "  s_b_mfm_fm removing gap4b data\n";
                        data.resize(sector.size());
                    }
                }
            }

            // If it's an 8K sector, attempt to validate any embedded checksum
            std::set<ChecksumType> chk8k_methods;
            if (sector.is_8k_sector())
            {
                chk8k_methods = ChecksumMethods(data.data(), data.size());
                if (opt.debug)
                    util::cout << "  s_b_mfm_fm chk8k_method = " << ChecksumName(chk8k_methods) << '\n';
            }

            // Consider good sectors overhanging the index
            if (final_sector && !bad_crc)
            {
                auto splice_offset = bitbuf.track_offset(dam_offset + (normal_bytes << shift));
                if (splice_offset < dam_offset)
                    bitbuf.splicepos(std::max(splice_offset, bitbuf.splicepos()));
            }

            sector.add(std::move(data), bad_crc, dam);

            // If the data is good there's no need to search for more data fields
            if (!bad_crc || !chk8k_methods.empty())
                break;
        }
    }

    trackdata.add(std::move(track));
}